

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::AtHelper<unsigned_int>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              uint length,Arguments *args,ScriptContext *scriptContext)

{
  code *pcVar1;
  double T1;
  bool bVar2;
  int iVar3;
  Var aValue;
  undefined4 *puVar4;
  INT64 IVar5;
  undefined4 extraout_var;
  RecyclableObject *pRVar6;
  ulong uVar7;
  undefined1 local_50 [8];
  JsReentLock jsReentLock;
  
  local_50 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_50)->noJsReentrancy;
  ((ThreadContext *)local_50)->noJsReentrancy = true;
  JsReentLock::setObjectForMutation((JsReentLock *)local_50,pArr);
  if (((ulong)args->Info & 0xfffffe) == 0) {
    uVar7 = 0;
    goto LAB_00b97ea5;
  }
  *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  aValue = Arguments::operator[](args,1);
  if (((ulong)aValue & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)aValue & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)aValue & 0xffff000000000000) == 0x1000000000000) goto LAB_00b97e64;
    T1 = JavascriptConversion::ToInteger_Full(aValue,scriptContext);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
LAB_00b97e64:
    T1 = (double)(int)aValue;
  }
  IVar5 = NumberUtilities::TryToInt64(T1);
  JsReentLock::MutateArrayObject((JsReentLock *)local_50);
  *(bool *)((long)local_50 + 0x108) = true;
  uVar7 = (ulong)((uint)(IVar5 >> 0x3f) & length) + IVar5;
LAB_00b97ea5:
  if (uVar7 < length) {
    if (typedArrayBase == (TypedArrayBase *)0x0) {
      *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      pRVar6 = (RecyclableObject *)JavascriptOperators::GetItem(obj,(uint32)uVar7,scriptContext);
      JsReentLock::MutateArrayObject((JsReentLock *)local_50);
      *(bool *)((long)local_50 + 0x108) = true;
    }
    else {
      iVar3 = (*(typedArrayBase->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                _vptr_IRecyclerVisitedObject[0x72])(typedArrayBase);
      pRVar6 = (RecyclableObject *)CONCAT44(extraout_var,iVar3);
    }
  }
  else {
    pRVar6 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
  }
  *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return pRVar6;
}

Assistant:

Var JavascriptArray::AtHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        // 3. Let relativeIndex be ? ToInteger(index).
        int64_t relativeIndex = 0;

        if (args.Info.Count > 1)
        {
            JS_REENTRANT(jsReentLock, relativeIndex = NumberUtilities::TryToInt64(JavascriptConversion::ToInteger(args[1], scriptContext)));
        }

        // 4. If relativeIndex >= 0, then
        //     a. Let k be relativeIndex.
        // 5. Else,
        //     a. Let k be len + relativeIndex.
        int64_t k = relativeIndex;
        
        if (relativeIndex < 0)
        {
            k += (int64_t)length;
        }
        
        // 6. If k < 0 or k >= len, then return undefined.
        if (k < 0 || k >= (int64_t)length)
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }
        
        
        if (typedArrayBase)
        {
            // %typedarray%.prototype.at(index): https://tc39.es/proposal-relative-indexing-method/#sec-array.prototype.at
            // 8. Return ? Get(O, ! ToString(k)).
            return typedArrayBase->DirectGetItem((uint32_t)k);
        }
        else
        {
            Var element;
            // 7. Return ? Get(O, ! ToString(k)).
            JS_REENTRANT(jsReentLock, element = JavascriptOperators::GetItem(obj, (T)k, scriptContext));
            return element;
        }
    }